

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

InstanceSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InstanceSymbol,char_const(&)[1],slang::SourceLocation_const&,slang::ast::InstanceBodySymbol&>
          (BumpAllocator *this,char (*args) [1],SourceLocation *args_1,InstanceBodySymbol *args_2)

{
  SourceLocation SVar1;
  InstanceSymbol *pIVar2;
  size_t sVar3;
  
  pIVar2 = (InstanceSymbol *)allocate(this,0x80,8);
  sVar3 = strlen(*args);
  SVar1 = *args_1;
  (pIVar2->super_InstanceSymbolBase).super_Symbol.kind = Instance;
  (pIVar2->super_InstanceSymbolBase).super_Symbol.name._M_len = sVar3;
  (pIVar2->super_InstanceSymbolBase).super_Symbol.name._M_str = *args;
  (pIVar2->super_InstanceSymbolBase).super_Symbol.location = SVar1;
  (pIVar2->super_InstanceSymbolBase).super_Symbol.parentScope = (Scope *)0x0;
  (pIVar2->super_InstanceSymbolBase).super_Symbol.nextInScope = (Symbol *)0x0;
  (pIVar2->super_InstanceSymbolBase).super_Symbol.indexInScope = 0;
  (pIVar2->super_InstanceSymbolBase).super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (pIVar2->super_InstanceSymbolBase).arrayPath._M_ptr = (pointer)0x0;
  (pIVar2->super_InstanceSymbolBase).arrayPath._M_extent._M_extent_value = 0;
  pIVar2->body = args_2;
  pIVar2->canonicalBody = (InstanceBodySymbol *)0x0;
  (pIVar2->connections)._M_ptr = (pointer)0x0;
  (pIVar2->connections)._M_extent._M_extent_value = 0;
  pIVar2->resolvedConfig = (ResolvedConfig *)0x0;
  pIVar2->connectionMap = (PointerMap *)0x0;
  args_2->parentInstance = pIVar2;
  return pIVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }